

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

char * __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::rec_serialize
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *this,Siblings *sib,
          char *buffer)

{
  stored_size_type sVar1;
  short *buffer_00;
  size_t __n;
  pointer ppVar2;
  pointer ppVar3;
  
  *(short *)buffer = (short)(sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
  buffer_00 = (short *)(buffer + 2);
  sVar1 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
  if (sVar1 != 0) {
    ppVar2 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
    ppVar3 = ppVar2 + sVar1;
    do {
      if (ppVar2 == (pointer)0x0) goto LAB_00124cd9;
      *buffer_00 = ppVar2->first;
      __n = (long)*(pointer *)((long)&(ppVar2->second).super_Filtration_simplex_base + 8) -
            *(long *)&(ppVar2->second).super_Filtration_simplex_base.filt_;
      *(long *)(buffer_00 + 1) = (long)__n >> 2;
      memcpy(buffer_00 + 5,*(void **)&(ppVar2->second).super_Filtration_simplex_base.filt_,__n);
      buffer_00 = (short *)((long)buffer_00 + __n + 10);
      ppVar2 = ppVar2 + 1;
    } while (ppVar2 != ppVar3);
  }
  sVar1 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
  if (sVar1 != 0) {
    ppVar3 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
    ppVar2 = ppVar3 + sVar1;
    do {
      if (ppVar3 == (pointer)0x0) {
LAB_00124cd9:
        __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                      "reference boost::container::vec_iterator<std::pair<short, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>>> *, true>::operator*() const [Pointer = std::pair<short, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>>> *, IsConst = true]"
                     );
      }
      if (((ppVar3->second).children_)->parent_ == ppVar3->first) {
        buffer_00 = (short *)rec_serialize(this,(ppVar3->second).children_,(char *)buffer_00);
      }
      else {
        *buffer_00 = 0;
        buffer_00 = buffer_00 + 1;
      }
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar2);
  }
  return (char *)buffer_00;
}

Assistant:

char* rec_serialize(Siblings const *sib, char* buffer) const {
    char* ptr = buffer;
    ptr = serialize_value_to_char_buffer(static_cast<Vertex_handle>(sib->members().size()), ptr);
#ifdef DEBUG_TRACES
    std::clog << "\n" << sib->members().size() << " : ";
#endif  // DEBUG_TRACES
    for (auto& map_el : sib->members()) {
      ptr = serialize_value_to_char_buffer(map_el.first, ptr); // Vertex
      if (Options::store_filtration)
        ptr = serialize_value_to_char_buffer(map_el.second.filtration(), ptr); // Filtration
#ifdef DEBUG_TRACES
      std::clog << " [ " << map_el.first << " | " << map_el.second.filtration() << " ] ";
#endif  // DEBUG_TRACES
    }
    for (auto& map_el : sib->members()) {
      if (has_children(&map_el)) {
        ptr = rec_serialize(map_el.second.children(), ptr);
      } else {
        ptr = serialize_value_to_char_buffer(static_cast<Vertex_handle>(0), ptr);
#ifdef DEBUG_TRACES
        std::cout << "\n0 : ";
#endif  // DEBUG_TRACES
      }
    }
    return ptr;
  }